

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

int __thiscall
ztimer::TimerManager::RegisterAbsTimer(TimerManager *this,unsigned_long timerId,string *timePoint)

{
  bool bVar1;
  time_point tVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  unsigned_long in_RSI;
  TimerManager *in_RDI;
  lock_guard<std::mutex> lk;
  time_point futureTime;
  TimerManager *in_stack_ffffffffffffff78;
  unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
  *in_stack_ffffffffffffff80;
  time_point *in_stack_ffffffffffffff88;
  TimerManager *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffd0;
  TimerManager *in_stack_ffffffffffffffd8;
  int local_4;
  
  tVar2 = Str2Time(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Now(in_stack_ffffffffffffff78);
  bVar1 = std::chrono::operator<
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    local_4 = 2;
  }
  else {
    bVar1 = TimePointValid(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
                 (mutex_type *)in_stack_ffffffffffffff78);
      bVar1 = TimerValid(in_RDI,in_RSI);
      if ((!bVar1) ||
         (bVar1 = TimerExist(in_stack_ffffffffffffff90,(unsigned_long)in_stack_ffffffffffffff88),
         bVar1)) {
        local_4 = 1;
      }
      else {
        pmVar3 = std::
                 unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                 ::operator[]((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                               *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
        *pmVar3 = 0;
        pmVar4 = std::
                 unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                 ::operator[]((unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                               *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
        (pmVar4->__d).__r = (rep)tVar2.__d.__r;
        std::
        vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
        ::operator[](&in_RDI->timeWheel,0);
        pmVar5 = std::
                 unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
                 ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
        pmVar5->_M_elems[0] = 2;
        pmVar5->_M_elems[1] = 0;
        pmVar5->_M_elems[2] = 0;
        local_4 = 0;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x180a8a);
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

int TimerManager::RegisterAbsTimer(unsigned long timerId, const std::string& timePoint)
    {
        auto futureTime = Str2Time(timePoint);
        if (futureTime < Now()) {
            return ERR_TIME_POINT_LATE;
        }

        if (!TimePointValid(futureTime)) {
            return ERR_TIME_POINT_FMT;
        }
        std::lock_guard<std::mutex> lk(mtx);
        if (!TimerValid(timerId) || TimerExist(timerId)) {
            return ERR_TIMER_ID_INVALID_EXIST;
        }
        timerMap[timerId] = 0;
        AbsTimerMap[timerId] = futureTime;
        timeWheel[0][timerId] = {ABS_ONCE, 0, 0};
        return ERR_OK;
    }